

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>::setCapacity
          (Vector<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> *this,size_t newSize)

{
  Entry *pEVar1;
  Entry *__dest;
  size_t __n;
  ArrayBuilder<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> local_38;
  
  pEVar1 = (this->builder).ptr;
  if (newSize < (ulong)(((long)(this->builder).pos - (long)pEVar1) / 0x18)) {
    (this->builder).pos = pEVar1 + newSize;
  }
  __dest = kj::_::HeapArrayDisposer::
           allocateUninitialized<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry>(newSize);
  local_38.endPtr = __dest + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pEVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pEVar1;
  local_38.ptr = __dest;
  if (__n != 0) {
    memcpy(__dest,pEVar1,__n);
  }
  local_38.pos = (RemoveConst<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> *)
                 ((long)__dest + __n);
  ArrayBuilder<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>::operator=
            (&this->builder,&local_38);
  ArrayBuilder<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>::dispose(&local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }